

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cpp
# Opt level: O2

void opt_Pop(void)

{
  OptStackEntry *__ptr;
  long lVar1;
  WarningState *pWVar2;
  WarningState *pWVar3;
  byte bVar4;
  
  __ptr = stack;
  bVar4 = 0;
  if (stack != (OptStackEntry *)0x0) {
    binDigits[0] = stack->binary[0];
    binDigits[1] = stack->binary[1];
    opt_G(stack->gbgfx);
    fillByte = __ptr->fillByte;
    fixPrecision = __ptr->fixPrecision;
    warnOnHaltNop = __ptr->warnOnHaltNop;
    haltNop = __ptr->haltNop;
    optimizeLoads = __ptr->optimizeLoads;
    warnOnLdOpt = __ptr->warnOnLdOpt;
    opt_R(__ptr->maxRecursionDepth);
    warningsAreErrors = __ptr->warningsAreErrors;
    pWVar2 = __ptr->warningStates;
    pWVar3 = warningStates;
    for (lVar1 = 0xb; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pWVar3 = *(undefined8 *)pWVar2;
      pWVar2 = pWVar2 + (ulong)bVar4 * -4 + 2;
      pWVar3 = pWVar3 + ((ulong)bVar4 * -2 + 1) * 2;
    }
    stack = __ptr->next;
    free(__ptr);
    return;
  }
  error("No entries in the option stack\n");
  return;
}

Assistant:

void opt_Pop(void)
{
	if (stack == NULL) {
		error("No entries in the option stack\n");
		return;
	}

	struct OptStackEntry *entry = stack;

	opt_B(entry->binary);
	opt_G(entry->gbgfx);
	opt_P(entry->fillByte);
	opt_Q(entry->fixPrecision);
	opt_H(entry->warnOnHaltNop);
	opt_h(entry->haltNop);
	opt_L(entry->optimizeLoads);
	opt_l(entry->warnOnLdOpt);
	opt_R(entry->maxRecursionDepth);

	// opt_W does not apply a whole warning state; it processes one flag string
	warningsAreErrors = entry->warningsAreErrors;
	memcpy(warningStates, entry->warningStates, numWarningStates);

	stack = entry->next;
	free(entry);
}